

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.cpp
# Opt level: O0

void __thiscall SQClass::SQClass(SQClass *this,SQSharedState *ss,SQClass *base)

{
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  SQTable *local_98;
  SQObjectPtr *local_58;
  long local_38;
  SQInteger _n_;
  SQClass *base_local;
  SQSharedState *ss_local;
  SQClass *this_local;
  
  SQCollectable::SQCollectable(&this->super_SQCollectable);
  (this->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted =
       (_func_int **)&PTR__SQClass_001577c0;
  sqvector<SQClassMember>::sqvector(&this->_defaultvalues);
  sqvector<SQClassMember>::sqvector(&this->_methods);
  local_58 = this->_metamethods;
  do {
    ::SQObjectPtr::SQObjectPtr(local_58);
    local_58 = local_58 + 1;
  } while (local_58 != &this->_attributes);
  ::SQObjectPtr::SQObjectPtr(&this->_attributes);
  this->_base = base;
  this->_typetag = (SQUserPointer)0x0;
  this->_hook = (SQRELEASEHOOK)0x0;
  this->_udsize = 0;
  this->_locked = false;
  this->_constructoridx = -1;
  if (this->_base != (SQClass *)0x0) {
    this->_constructoridx = this->_base->_constructoridx;
    this->_udsize = this->_base->_udsize;
    sqvector<SQClassMember>::copy(&this->_defaultvalues,(EVP_PKEY_CTX *)&base->_defaultvalues,src);
    sqvector<SQClassMember>::copy(&this->_methods,(EVP_PKEY_CTX *)&base->_methods,src_00);
    for (local_38 = 0; local_38 < 0x12; local_38 = local_38 + 1) {
      ::SQObjectPtr::operator=(this->_metamethods + local_38,base->_metamethods + local_38);
    }
    (this->_base->super_SQCollectable).super_SQRefCounted._uiRef =
         (this->_base->super_SQCollectable).super_SQRefCounted._uiRef + 1;
  }
  if (base == (SQClass *)0x0) {
    local_98 = SQTable::Create(ss,0);
  }
  else {
    local_98 = SQTable::Clone(base->_members);
  }
  this->_members = local_98;
  (this->_members->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef =
       (this->_members->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef + 1;
  (this->super_SQCollectable)._next = (SQCollectable *)0x0;
  (this->super_SQCollectable)._prev = (SQCollectable *)0x0;
  (this->super_SQCollectable)._sharedstate = ss;
  SQCollectable::AddToChain
            (&((this->super_SQCollectable)._sharedstate)->_gc_chain,(SQCollectable_conflict *)this);
  return;
}

Assistant:

SQClass::SQClass(SQSharedState *ss,SQClass *base)
{
    _base = base;
    _typetag = 0;
    _hook = NULL;
    _udsize = 0;
    _locked = false;
    _constructoridx = -1;
    if(_base) {
        _constructoridx = _base->_constructoridx;
        _udsize = _base->_udsize;
        _defaultvalues.copy(base->_defaultvalues);
        _methods.copy(base->_methods);
        _COPY_VECTOR(_metamethods,base->_metamethods,MT_LAST);
        __ObjAddRef(_base);
    }
    _members = base?base->_members->Clone() : SQTable::Create(ss,0);
    __ObjAddRef(_members);

    INIT_CHAIN();
    ADD_TO_CHAIN(&_sharedstate->_gc_chain, this);
}